

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O0

DataLisp * __thiscall DL::DataLisp::dump_abi_cxx11_(DataLisp *this)

{
  vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_> *this_00;
  bool bVar1;
  reference ppSVar2;
  undefined8 *in_RSI;
  StatementNode *local_50;
  StatementNode *ptr;
  iterator __end2;
  iterator __begin2;
  vector_t<StatementNode_*> *__range2;
  allocator local_19 [9];
  DataLisp *this_local;
  string_t *str;
  
  this_local = this;
  if (*(long *)*in_RSI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    std::__cxx11::string::string((string *)this);
    this_00 = *(vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_> **)*in_RSI;
    __end2 = std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>::begin(this_00);
    ptr = (StatementNode *)
          std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
                                       *)&ptr), bVar1) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
                ::operator*(&__end2);
      local_50 = *ppSVar2;
      DataLisp_Internal::dumpNode_abi_cxx11_
                ((DataLisp_Internal *)&stack0xffffffffffffff90,local_50,1);
      std::__cxx11::string::operator+=((string *)this,(string *)&stack0xffffffffffffff90);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      __gnu_cxx::
      __normal_iterator<DL::StatementNode_**,_std::vector<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>_>
      ::operator++(&__end2);
    }
  }
  return this;
}

Assistant:

string_t DataLisp::dump()
{
	if (!mInternal->mTree) {
		return "";
	} else {
		string_t str;
		for (StatementNode* ptr : mInternal->mTree->Nodes)
			str += DataLisp_Internal::dumpNode(ptr, 1);

		return str;
	}
}